

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t exr_attr_string_vector_destroy(exr_context_t ctxt,exr_attr_string_vector_t *sv)

{
  long lVar1;
  int *in_RSI;
  long in_RDI;
  int32_t i;
  exr_attr_string_t *strs;
  exr_attr_string_vector_t nil;
  _internal_exr_context *pctxt;
  int local_3c;
  exr_attr_string_t *in_stack_ffffffffffffffd0;
  exr_context_t in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (int *)0x0) {
      memset(&stack0xffffffffffffffd0,0,0x10);
      if (0 < in_RSI[1]) {
        lVar1 = *(long *)(in_RSI + 2);
        for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
          exr_attr_string_destroy(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        }
        if (lVar1 != 0) {
          (**(code **)(in_RDI + 0x60))(lVar1);
        }
      }
      *(exr_attr_string_t **)in_RSI = in_stack_ffffffffffffffd0;
      *(exr_context_t *)(in_RSI + 2) = in_stack_ffffffffffffffd8;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_vector_destroy (
    exr_context_t ctxt, exr_attr_string_vector_t* sv)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sv)
    {
        exr_attr_string_vector_t nil = {0};
        if (sv->alloc_size > 0)
        {
            exr_attr_string_t* strs =
                EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
            for (int32_t i = 0; i < sv->n_strings; ++i)
                exr_attr_string_destroy (ctxt, strs + i);
            if (strs) pctxt->free_fn (strs);
        }
        *sv = nil;
    }
    return EXR_ERR_SUCCESS;
}